

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_name.h
# Opt level: O3

string * beast::type_name<std::overflow_error>(void)

{
  char *pcVar1;
  char *__ptr;
  string *in_RDI;
  char *__s;
  
  pcVar1 = _use_facet<std::codecvt<wchar_t,char,__mbstate_t>>;
  __ptr = (char *)__cxa_demangle(_use_facet<std::codecvt<wchar_t,char,__mbstate_t>> +
                                 (*_use_facet<std::codecvt<wchar_t,char,__mbstate_t>> == '*'),0,0,0)
  ;
  __s = __ptr;
  if (__ptr == (char *)0x0) {
    __s = pcVar1 + (*pcVar1 == '*');
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>();
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    using TR = typename std::remove_reference<T>::type;
    std::unique_ptr<char, void(*)(void*)> own (
    #ifndef _MSC_VER
        abi::__cxa_demangle (typeid(TR).name(), nullptr,
            nullptr, nullptr),
    #else
            nullptr,
    #endif
            std::free
    );
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}